

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssutil.cpp
# Opt level: O3

void qDrawRoundedCorners(QPainter *p,qreal x1,qreal y1,qreal x2,qreal y2,QSizeF *r1,QSizeF *r2,
                        Edge edge,BorderStyle s,QBrush c)

{
  int iVar1;
  Edge edge_00;
  BorderStyle s_00;
  DataPtr DVar2;
  long in_FS_OFFSET;
  double dVar3;
  double dVar4;
  QColor color;
  QColor QVar5;
  QPen pen;
  QBrush local_b0;
  undefined1 local_a8 [8];
  QBrush local_a0;
  undefined1 local_98 [8];
  QBrush local_90;
  undefined1 local_88 [8];
  QBrush local_80;
  undefined1 local_78 [8];
  QBrush local_70;
  undefined1 local_68 [8];
  undefined1 local_60 [8];
  undefined1 local_58 [8];
  undefined1 local_50 [8];
  undefined1 local_48 [8];
  undefined1 local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((edge & ~BottomEdge) == TopEdge) {
    dVar4 = y2 - y1;
  }
  else {
    dVar4 = x2 - x1;
  }
  if (s == BorderStyle_Double) {
    if (edge < NumEdges) {
      dVar4 = dVar4 / 3.0;
      switch(edge) {
      default:
        QBrush::QBrush((QBrush *)local_40,
                       (QBrush *)
                       c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
        qDrawRoundedCorners(p,x1,y1,x2,dVar4 + y1,r1,r2,edge,BorderStyle_Solid,(QBrush)local_40);
        QBrush::~QBrush((QBrush *)local_40);
        dVar3 = y2 - dVar4;
        DVar2._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
        super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
        super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
             (__uniq_ptr_data<QBrushData,_QBrushDataPointerDeleter,_true,_true>)local_48;
        QBrush::QBrush((QBrush *)
                       DVar2._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl,
                       (QBrush *)
                       c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
        break;
      case RightEdge:
        dVar3 = y1 + 1.0;
        QBrush::QBrush((QBrush *)local_60,
                       (QBrush *)
                       c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
        qDrawRoundedCorners(p,x1,dVar3,dVar4 + x1,y2,r1,r2,RightEdge,BorderStyle_Solid,
                            (QBrush)local_60);
        QBrush::~QBrush((QBrush *)local_60);
        x1 = x2 - dVar4;
        DVar2._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
        super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
        super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
             (__uniq_ptr_data<QBrushData,_QBrushDataPointerDeleter,_true,_true>)local_68;
        QBrush::QBrush((QBrush *)
                       DVar2._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl,
                       (QBrush *)
                       c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
        edge = RightEdge;
        break;
      case LeftEdge:
        dVar3 = y1 + 1.0;
        QBrush::QBrush((QBrush *)local_50,
                       (QBrush *)
                       c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
        qDrawRoundedCorners(p,x1,dVar3,dVar4 + x1,y2,r1,r2,LeftEdge,BorderStyle_Solid,
                            (QBrush)local_50);
        QBrush::~QBrush((QBrush *)local_50);
        x1 = x2 - dVar4;
        DVar2._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
        super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
        super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
             (__uniq_ptr_data<QBrushData,_QBrushDataPointerDeleter,_true,_true>)local_58;
        QBrush::QBrush((QBrush *)
                       DVar2._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl,
                       (QBrush *)
                       c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
        edge = LeftEdge;
      }
      qDrawRoundedCorners(p,x1,dVar3,x2,y2,r1,r2,edge,BorderStyle_Solid,
                          (QBrush)DVar2._M_t.
                                  super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                                  super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                                  super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
      QBrush::~QBrush((QBrush *)
                      DVar2._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                      super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                      super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
    }
    goto LAB_005d4def;
  }
  if ((s & ~BorderStyle_None) == BorderStyle_Groove) {
    if (edge < NumEdges) {
      iVar1 = (int)((double)((ulong)(dVar4 * 0.5) & 0x8000000000000000 | (ulong)DAT_00674780) +
                   dVar4 * 0.5);
      s_00 = s == BorderStyle_Groove ^ BorderStyle_Outset;
      dVar3 = y1;
      switch((ulong)edge) {
      case 0:
        dVar3 = (double)iVar1 + y1;
        QBrush::QBrush(&local_70,
                       (QBrush *)
                       c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
        qDrawRoundedCorners(p,x1,y1,x2,dVar3,r1,r2,TopEdge,s_00,(QBrush)&local_70);
        QBrush::~QBrush(&local_70);
        DVar2._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
        super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
        super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
             (__uniq_ptr_data<QBrushData,_QBrushDataPointerDeleter,_true,_true>)local_78;
        QBrush::QBrush((QBrush *)
                       DVar2._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl,
                       (QBrush *)
                       c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
        edge_00 = TopEdge;
        break;
      case 1:
        QBrush::QBrush(&local_a0,
                       (QBrush *)
                       c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
        qDrawRoundedCorners(p,(double)iVar1 + x1,y1,x2,y2,r1,r2,RightEdge,s_00,(QBrush)&local_a0);
        QBrush::~QBrush(&local_a0);
        x2 = x2 - (double)iVar1;
        DVar2._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
        super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
        super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
             (__uniq_ptr_data<QBrushData,_QBrushDataPointerDeleter,_true,_true>)local_a8;
        QBrush::QBrush((QBrush *)
                       DVar2._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl,
                       (QBrush *)
                       c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
        edge_00 = RightEdge;
        break;
      case 2:
        QBrush::QBrush(&local_80,
                       (QBrush *)
                       c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
        qDrawRoundedCorners(p,x1,(double)iVar1 + y1,x2,y2,r1,r2,BottomEdge,s_00,(QBrush)&local_80);
        QBrush::~QBrush(&local_80);
        y2 = y2 - (double)iVar1;
        DVar2._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
        super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
        super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
             (__uniq_ptr_data<QBrushData,_QBrushDataPointerDeleter,_true,_true>)local_88;
        QBrush::QBrush((QBrush *)
                       DVar2._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl,
                       (QBrush *)
                       c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
        edge_00 = BottomEdge;
        break;
      case 3:
        QBrush::QBrush(&local_90,
                       (QBrush *)
                       c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
        qDrawRoundedCorners(p,x1,y1,(double)iVar1 + x1,y2,r1,r2,LeftEdge,s_00,(QBrush)&local_90);
        QBrush::~QBrush(&local_90);
        DVar2._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
        super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
        super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
             (__uniq_ptr_data<QBrushData,_QBrushDataPointerDeleter,_true,_true>)local_98;
        QBrush::QBrush((QBrush *)
                       DVar2._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl,
                       (QBrush *)
                       c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
        edge_00 = LeftEdge;
        x1 = (double)iVar1 + x1;
      }
      qDrawRoundedCorners(p,x1,dVar3,x2,y2,r1,r2,edge_00,
                          (s == BorderStyle_Groove) + BorderStyle_Inset,
                          (QBrush)DVar2._M_t.
                                  super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                                  super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                                  super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
      QBrush::~QBrush((QBrush *)
                      DVar2._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                      super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                      super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
    }
  }
  else if (s == BorderStyle_Inset) {
    if (edge - RightEdge < 2) goto LAB_005d4717;
  }
  else if ((s == BorderStyle_Outset) && ((edge == TopEdge || (edge == LeftEdge)))) {
LAB_005d4717:
    QVar5 = QColor::lighter((QColor *)
                            (*(long *)c.d._M_t.
                                      super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>.
                                      _M_t.
                                      super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>
                                      .super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl + 8),
                            0x96);
    color._8_8_ = QVar5._8_8_ & 0xffffffffffff;
    color._0_8_ = QVar5._0_8_;
    QBrush::operator=((QBrush *)
                      c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                      super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                      super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl,color);
  }
  QPainter::save(p);
  QPainter::setBrush(p,NoBrush);
  local_b0.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
  super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
  super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (DataPtr)&DAT_aaaaaaaaaaaaaaaa;
  qPenFromStyle(&local_b0,dVar4,
                (BorderStyle)
                c.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl);
  QPen::setCapStyle((QPen *)&local_b0,SquareCap);
  QPainter::setPen(p,(QPen *)&local_b0);
  if (edge < NumEdges) {
    (*(code *)(&DAT_006c14d4 + *(int *)(&DAT_006c14d4 + (ulong)edge * 4)))();
    return;
  }
  QPainter::restore(p);
  QPen::~QPen((QPen *)&local_b0);
LAB_005d4def:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void qDrawRoundedCorners(QPainter *p, qreal x1, qreal y1, qreal x2, qreal y2,
                         const QSizeF& r1, const QSizeF& r2,
                         Edge edge, BorderStyle s, QBrush c)
{
    const qreal pw = (edge == TopEdge || edge == BottomEdge) ? y2-y1 : x2-x1;
    if (s == BorderStyle_Double) {
        qreal wby3 = pw/3;
        switch (edge) {
        case TopEdge:
        case BottomEdge:
            qDrawRoundedCorners(p, x1, y1, x2, y1+wby3, r1, r2, edge, BorderStyle_Solid, c);
            qDrawRoundedCorners(p, x1, y2-wby3, x2, y2, r1, r2, edge, BorderStyle_Solid, c);
            break;
        case LeftEdge:
            qDrawRoundedCorners(p, x1, y1+1, x1+wby3, y2, r1, r2, LeftEdge, BorderStyle_Solid, c);
            qDrawRoundedCorners(p, x2-wby3, y1+1, x2, y2, r1, r2, LeftEdge, BorderStyle_Solid, c);
            break;
        case RightEdge:
            qDrawRoundedCorners(p, x1, y1+1, x1+wby3, y2, r1, r2, RightEdge, BorderStyle_Solid, c);
            qDrawRoundedCorners(p, x2-wby3, y1+1, x2, y2, r1, r2, RightEdge, BorderStyle_Solid, c);
            break;
        default:
            break;
        }
        return;
    } else if (s == BorderStyle_Ridge || s == BorderStyle_Groove) {
        BorderStyle s1, s2;
        if (s == BorderStyle_Groove) {
            s1 = BorderStyle_Inset;
            s2 = BorderStyle_Outset;
        } else {
            s1 = BorderStyle_Outset;
            s2 = BorderStyle_Inset;
        }
        int pwby2 = qRound(pw/2);
        switch (edge) {
        case TopEdge:
            qDrawRoundedCorners(p, x1, y1, x2, y1 + pwby2, r1, r2, TopEdge, s1, c);
            qDrawRoundedCorners(p, x1, y1 + pwby2, x2, y2, r1, r2, TopEdge, s2, c);
            break;
        case BottomEdge:
            qDrawRoundedCorners(p, x1, y1 + pwby2, x2, y2, r1, r2, BottomEdge, s1, c);
            qDrawRoundedCorners(p, x1, y1, x2, y2-pwby2, r1, r2, BottomEdge, s2, c);
            break;
        case LeftEdge:
            qDrawRoundedCorners(p, x1, y1, x1 + pwby2, y2, r1, r2, LeftEdge, s1, c);
            qDrawRoundedCorners(p, x1 + pwby2, y1, x2, y2, r1, r2, LeftEdge, s2, c);
            break;
        case RightEdge:
            qDrawRoundedCorners(p, x1 + pwby2, y1, x2, y2, r1, r2, RightEdge, s1, c);
            qDrawRoundedCorners(p, x1, y1, x2 - pwby2, y2, r1, r2, RightEdge, s2, c);
            break;
        default:
            break;
        }
    } else if ((s == BorderStyle_Outset && (edge == TopEdge || edge == LeftEdge))
            || (s == BorderStyle_Inset && (edge == BottomEdge || edge == RightEdge)))
            c = c.color().lighter();

    p->save();
    qreal pwby2 = pw/2;
    p->setBrush(Qt::NoBrush);
    QPen pen = qPenFromStyle(c, pw, s);
    pen.setCapStyle(Qt::SquareCap); // this eliminates the offby1 errors that we might hit below
    p->setPen(pen);
    switch (edge) {
    case TopEdge:
        if (!r1.isEmpty())
            p->drawArc(QRectF(x1 - r1.width() + pwby2, y1 + pwby2,
                              2*r1.width() - pw, 2*r1.height() - pw), 135*16, -45*16);
        if (!r2.isEmpty())
            p->drawArc(QRectF(x2 - r2.width() + pwby2, y1 + pwby2,
                       2*r2.width() - pw, 2*r2.height() - pw), 45*16, 45*16);
        break;
    case BottomEdge:
        if (!r1.isEmpty())
            p->drawArc(QRectF(x1 - r1.width() + pwby2, y2 - 2*r1.height() + pwby2,
                              2*r1.width() - pw, 2*r1.height() - pw), -90 * 16, -45 * 16);
        if (!r2.isEmpty())
            p->drawArc(QRectF(x2 - r2.width() + pwby2, y2 - 2*r2.height() + pwby2,
                       2*r2.width() - pw, 2*r2.height() - pw), -90 * 16, 45 * 16);
        break;
    case LeftEdge:
        if (!r1.isEmpty())
            p->drawArc(QRectF(x1 + pwby2, y1 - r1.height() + pwby2,
                       2*r1.width() - pw, 2*r1.height() - pw), 135*16, 45*16);
        if (!r2.isEmpty())
            p->drawArc(QRectF(x1 + pwby2, y2 - r2.height() + pwby2,
                       2*r2.width() - pw, 2*r2.height() - pw), 180*16, 45*16);
        break;
    case RightEdge:
        if (!r1.isEmpty())
            p->drawArc(QRectF(x2 - 2*r1.width() + pwby2, y1 - r1.height() + pwby2,
                       2*r1.width() - pw, 2*r1.height() - pw), 45*16, -45*16);
        if (!r2.isEmpty())
            p->drawArc(QRectF(x2 - 2*r2.width() + pwby2, y2 - r2.height() + pwby2,
                       2*r2.width() - pw, 2*r2.height() - pw), 315*16, 45*16);
        break;
    default:
        break;
    }
    p->restore();
}